

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtScaledBvhTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtScaledTriangleCallback::processTriangle
          (cbtScaledTriangleCallback *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  fVar1 = (this->m_localScaling).m_floats[2];
  uVar2 = *(undefined8 *)(this->m_localScaling).m_floats;
  fVar3 = (float)uVar2;
  auVar5._0_4_ = (float)*(undefined8 *)triangle->m_floats * fVar3;
  fVar4 = (float)((ulong)uVar2 >> 0x20);
  auVar5._4_4_ = (float)((ulong)*(undefined8 *)triangle->m_floats >> 0x20) * fVar4;
  auVar5._8_8_ = 0;
  local_38 = vinsertps_avx(auVar5,ZEXT416((uint)(fVar1 * triangle->m_floats[2])),0x28);
  auVar6._0_4_ = fVar3 * (float)*(undefined8 *)triangle[1].m_floats;
  auVar6._4_4_ = fVar4 * (float)((ulong)*(undefined8 *)triangle[1].m_floats >> 0x20);
  auVar6._8_8_ = 0;
  local_28 = vinsertps_avx(auVar6,ZEXT416((uint)(fVar1 * triangle[1].m_floats[2])),0x28);
  auVar7._0_4_ = fVar3 * (float)*(undefined8 *)triangle[2].m_floats;
  auVar7._4_4_ = fVar4 * (float)((ulong)*(undefined8 *)triangle[2].m_floats >> 0x20);
  auVar7._8_8_ = 0;
  local_18 = vinsertps_avx(auVar7,ZEXT416((uint)(fVar1 * triangle[2].m_floats[2])),0x28);
  (*this->m_originalCallback->_vptr_cbtTriangleCallback[2])(this->m_originalCallback,local_38);
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		cbtVector3 newTriangle[3];
		newTriangle[0] = triangle[0] * m_localScaling;
		newTriangle[1] = triangle[1] * m_localScaling;
		newTriangle[2] = triangle[2] * m_localScaling;
		m_originalCallback->processTriangle(&newTriangle[0], partId, triangleIndex);
	}